

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

SW_FT_Error
SW_FT_Stroker_GetCounts(SW_FT_Stroker stroker,SW_FT_UInt *anum_points,SW_FT_UInt *anum_contours)

{
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  SW_FT_Error error;
  SW_FT_UInt num_contours;
  SW_FT_UInt count4;
  SW_FT_UInt count3;
  SW_FT_UInt num_points;
  SW_FT_UInt count2;
  SW_FT_UInt count1;
  SW_FT_Error local_34;
  int local_30;
  SW_FT_UInt local_2c;
  SW_FT_UInt local_28;
  int local_24;
  SW_FT_UInt local_20;
  SW_FT_UInt local_1c;
  int *local_18;
  int *local_10;
  long local_8;
  
  local_24 = 0;
  local_30 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_34 = ft_stroke_border_get_counts((SW_FT_StrokeBorder)(in_RDI + 0x70),&local_1c,&local_20);
  if ((local_34 == 0) &&
     (local_34 = ft_stroke_border_get_counts
                           ((SW_FT_StrokeBorder)(local_8 + 0x98),&local_28,&local_2c), local_34 == 0
     )) {
    local_24 = local_1c + local_28;
    local_30 = local_20 + local_2c;
  }
  *local_10 = local_24;
  *local_18 = local_30;
  return local_34;
}

Assistant:

SW_FT_Error SW_FT_Stroker_GetCounts(SW_FT_Stroker stroker,
                                    SW_FT_UInt*   anum_points,
                                    SW_FT_UInt*   anum_contours)
{
    SW_FT_UInt  count1, count2, num_points = 0;
    SW_FT_UInt  count3, count4, num_contours = 0;
    SW_FT_Error error;

    error = ft_stroke_border_get_counts(stroker->borders + 0, &count1, &count2);
    if (error) goto Exit;

    error = ft_stroke_border_get_counts(stroker->borders + 1, &count3, &count4);
    if (error) goto Exit;

    num_points = count1 + count3;
    num_contours = count2 + count4;

Exit:
    *anum_points = num_points;
    *anum_contours = num_contours;
    return error;
}